

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v5::internal::
       format_decimal<unsigned_int,char,fmt::v5::internal::add_thousands_sep<char>>
                 (char *buffer,uint value,int num_digits,add_thousands_sep<char> thousands_sep)

{
  bool bVar1;
  assertion_failure *this;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  byte bVar5;
  uint uVar6;
  
  if (-1 < num_digits) {
    pcVar3 = buffer + (uint)num_digits;
    pcVar4 = pcVar3;
    uVar6 = value;
    if (99 < value) {
      do {
        value = uVar6 / 100;
        uVar2 = (ulong)((uVar6 % 100) * 2);
        pcVar4[-1] = basic_data<void>::DIGITS[uVar2 + 1];
        pcVar4 = pcVar4 + -1;
        if ((thousands_sep.digit_index_ + 1) * -0x55555555 < 0x55555556) {
          pcVar4 = pcVar4 + -thousands_sep.sep_.size_;
          if (thousands_sep.sep_.size_ != 0) {
            memmove(pcVar4,thousands_sep.sep_.data_,thousands_sep.sep_.size_);
          }
        }
        pcVar4[-1] = basic_data<void>::DIGITS[uVar2];
        pcVar4 = pcVar4 + -1;
        thousands_sep.digit_index_ = thousands_sep.digit_index_ + 2;
        if (thousands_sep.digit_index_ * -0x55555555 < 0x55555556) {
          pcVar4 = pcVar4 + -thousands_sep.sep_.size_;
          if (thousands_sep.sep_.size_ != 0) {
            memmove(pcVar4,thousands_sep.sep_.data_,thousands_sep.sep_.size_);
          }
        }
        bVar1 = 9999 < uVar6;
        uVar6 = value;
      } while (bVar1);
    }
    if (value < 10) {
      bVar5 = (byte)value | 0x30;
    }
    else {
      pcVar4[-1] = basic_data<void>::DIGITS[((ulong)value * 2 & 0xffffffff) + 1];
      pcVar4 = pcVar4 + -1;
      if ((thousands_sep.digit_index_ + 1) * -0x55555555 < 0x55555556) {
        pcVar4 = pcVar4 + -thousands_sep.sep_.size_;
        if (thousands_sep.sep_.size_ != 0) {
          memmove(pcVar4,thousands_sep.sep_.data_,thousands_sep.sep_.size_);
        }
      }
      bVar5 = basic_data<void>::DIGITS[(ulong)value * 2];
    }
    pcVar4[-1] = bVar5;
    return pcVar3;
  }
  this = (assertion_failure *)__cxa_allocate_exception(0x10);
  assertion_failure::assertion_failure(this,"invalid digit count");
  __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}